

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O2

void config_init(OperationConfig *config)

{
  memset(config,0,0x4f0);
  config->maxredirs = 0x32;
  config->proto_default = (char *)0x0;
  config->happy_eyeballs_timeout_ms = 200;
  *(undefined8 *)&config->field_0x4e4 = 0x10010000000000;
  config->upload_flags = '\x10';
  curlx_dyn_init(&config->postdata,0x400000000);
  return;
}

Assistant:

void config_init(struct OperationConfig *config)
{
  memset(config, 0, sizeof(struct OperationConfig));

  config->use_httpget = FALSE;
  config->create_dirs = FALSE;
  config->maxredirs = DEFAULT_MAXREDIRS;
  config->proto_present = FALSE;
  config->proto_redir_present = FALSE;
  config->proto_default = NULL;
  config->tcp_nodelay = TRUE; /* enabled by default */
  config->happy_eyeballs_timeout_ms = CURL_HET_DEFAULT;
  config->http09_allowed = FALSE;
  config->ftp_skip_ip = TRUE;
  config->file_clobber_mode = CLOBBER_DEFAULT;
  config->upload_flags = CURLULFLAG_SEEN;
  curlx_dyn_init(&config->postdata, MAX_FILE2MEMORY);
}